

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall slang::ast::TypePrinter::append(TypePrinter *this,Type *type)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  Symbol *in_RSI;
  byte *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_00000590;
  TypePrinter *in_stack_00000598;
  Symbol *in_stack_000005a0;
  size_t in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  Symbol *in_stack_ffffffffffffff48;
  FormatBuffer *in_stack_ffffffffffffff50;
  pointer in_stack_ffffffffffffff58;
  pointer in_stack_ffffffffffffff60;
  Scope *in_stack_ffffffffffffff78;
  Type *in_stack_ffffffffffffffb8;
  TypePrinter *in_stack_ffffffffffffffc0;
  
  if ((*in_RDI & 1) != 0) {
    in_stack_ffffffffffffff60 =
         std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                   ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                    0xa794e7);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff50,
               (char *)in_stack_ffffffffffffff48);
    str._M_str = (char *)in_stack_ffffffffffffff60;
    str._M_len = (size_t)in_stack_ffffffffffffff58;
    FormatBuffer::append(in_stack_ffffffffffffff50,str);
  }
  if (((in_RDI[2] & 1) == 0) || (in_RSI->kind != TypeAlias)) {
    in_stack_ffffffffffffff48 = in_RSI;
    sv((char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_000005a0,in_stack_00000598,in_stack_00000590);
  }
  else {
    if ((in_RDI[1] & 1) == 0) {
      in_stack_ffffffffffffff58 =
           std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                      0xa79557);
      Symbol::getParentScope(in_RSI);
      in_stack_ffffffffffffff50 = (FormatBuffer *)&stack0xffffffffffffffb0;
      getLexicalPath_abi_cxx11_(in_stack_ffffffffffffff78);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff40);
      str_00._M_str = (char *)in_stack_ffffffffffffff60;
      str_00._M_len = (size_t)in_stack_ffffffffffffff58;
      FormatBuffer::append(in_stack_ffffffffffffff50,str_00);
      std::__cxx11::string::~string(in_stack_ffffffffffffff40);
    }
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0xa795e8);
    str_01._M_str = (char *)in_stack_ffffffffffffff60;
    str_01._M_len = (size_t)in_stack_ffffffffffffff58;
    FormatBuffer::append(in_stack_ffffffffffffff50,str_01);
  }
  if ((*in_RDI & 1) != 0) {
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0xa79669);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff50,
               (char *)in_stack_ffffffffffffff48);
    str_02._M_str = (char *)in_stack_ffffffffffffff60;
    str_02._M_len = (size_t)in_stack_ffffffffffffff58;
    FormatBuffer::append(in_stack_ffffffffffffff50,str_02);
  }
  if (((in_RDI[2] & 1) != 0) && (in_RSI->kind == TypeAlias)) {
    printAKA(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void TypePrinter::append(const Type& type) {
    if (options.addSingleQuotes)
        buffer->append("'");

    if (options.printAKA && type.kind == SymbolKind::TypeAlias) {
        if (!options.elideScopeNames)
            buffer->append(getLexicalPath(type.getParentScope()));
        buffer->append(type.name);
    }
    else {
        type.visit(*this, ""sv);
    }

    if (options.addSingleQuotes)
        buffer->append("'");

    if (options.printAKA && type.kind == SymbolKind::TypeAlias)
        printAKA(type);
}